

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qundogroup.cpp
# Opt level: O2

void QUndoGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(QUndoStack*)>
                      ((QtMocHelpers *)_a,(void **)activeStackChanged,0,0);
    if ((((!bVar1) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(int)>
                            ((QtMocHelpers *)_a,(void **)indexChanged,0,1), !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(bool)>
                           ((QtMocHelpers *)_a,(void **)cleanChanged,0,2), !bVar1)) &&
       (((bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)canUndoChanged,0,3), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)canRedoChanged,0,4), !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(QString_const&)>
                           ((QtMocHelpers *)_a,(void **)undoTextChanged,0,5), !bVar1)))) {
      QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(QString_const&)>
                ((QtMocHelpers *)_a,(void **)redoTextChanged,0,6);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      activeStackChanged((QUndoGroup *)_o,*_a[1]);
      return;
    case 1:
      indexChanged((QUndoGroup *)_o,*_a[1]);
      return;
    case 2:
      cleanChanged((QUndoGroup *)_o,*_a[1]);
      return;
    case 3:
      canUndoChanged((QUndoGroup *)_o,*_a[1]);
      return;
    case 4:
      canRedoChanged((QUndoGroup *)_o,*_a[1]);
      return;
    case 5:
      undoTextChanged((QUndoGroup *)_o,(QString *)_a[1]);
      return;
    case 6:
      redoTextChanged((QUndoGroup *)_o,(QString *)_a[1]);
      return;
    case 7:
      undo((QUndoGroup *)_o);
      return;
    case 8:
      redo((QUndoGroup *)_o);
      return;
    case 9:
      setActiveStack((QUndoGroup *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QUndoGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUndoGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activeStackChanged((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        case 1: _t->indexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->cleanChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->canUndoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->canRedoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->undoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 6: _t->redoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->undo(); break;
        case 8: _t->redo(); break;
        case 9: _t->setActiveStack((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(QUndoStack * )>(_a, &QUndoGroup::activeStackChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(int )>(_a, &QUndoGroup::indexChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::cleanChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canUndoChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canRedoChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::undoTextChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::redoTextChanged, 6))
            return;
    }
}